

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

void Dau_DsdTruthCompose_rec(word *pFunc,word (*pFanins) [64],word *pRes,int nVars,int nWordsR)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  word *pwVar8;
  word *pwVar9;
  ulong uVar10;
  uint uVar11;
  word *pwVar12;
  word pTtTemp [2] [64];
  word local_438 [64];
  word local_238 [65];
  
  if (6 < nVars) {
    pwVar12 = pFanins[nVars - 1];
    do {
      uVar11 = 1 << ((byte)(nVars + -6) & 0x1f);
      if ((int)uVar11 < 2) {
        __assert_fail("nWordsF > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                      ,0x1fe,"void Dau_DsdTruthCompose_rec(word *, word (*)[64], word *, int, int)")
        ;
      }
      uVar3 = (ulong)uVar11;
      uVar6 = 0;
      while (pFunc[uVar6] == 0) {
        uVar6 = uVar6 + 1;
        if (uVar3 == uVar6) {
          if (nWordsR < 1) {
            return;
          }
          iVar4 = 0;
          goto LAB_0050e9cb;
        }
      }
      uVar6 = 0;
      while (pFunc[uVar6] == 0xffffffffffffffff) {
        uVar6 = uVar6 + 1;
        if (uVar3 == uVar6) {
          if (nWordsR < 1) {
            return;
          }
          iVar4 = 0xff;
LAB_0050e9cb:
          memset(pRes,iVar4,(ulong)(uint)nWordsR << 3);
          return;
        }
      }
      iVar4 = nVars + -1;
      if (nVars + -6 != 0x1f) {
        bVar2 = (byte)(nVars + -7);
        uVar5 = 1 << (bVar2 & 0x1f);
        iVar7 = 2 << (bVar2 & 0x1f);
        uVar6 = 1;
        if (1 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
        pwVar8 = pFunc + (int)uVar5;
        pwVar9 = pFunc;
        do {
          if (nVars + -7 != 0x1f) {
            uVar10 = 0;
            do {
              if (pwVar9[uVar10] != pwVar8[uVar10]) {
                Dau_DsdTruthCompose_rec(pFunc,pFanins,local_438,iVar4,nWordsR);
                Dau_DsdTruthCompose_rec(pFunc + (uVar11 >> 1),pFanins,local_238,iVar4,nWordsR);
                if (nWordsR < 1) {
                  return;
                }
                uVar3 = 0;
                do {
                  pRes[uVar3] = (local_238[uVar3] ^ local_438[uVar3]) & *pwVar12 ^ local_438[uVar3];
                  uVar3 = uVar3 + 1;
                  pwVar12 = pwVar12 + 1;
                } while ((uint)nWordsR != uVar3);
                return;
              }
              uVar10 = uVar10 + 1;
            } while (uVar6 != uVar10);
          }
          pwVar9 = pwVar9 + iVar7;
          pwVar8 = pwVar8 + iVar7;
        } while (pwVar9 < pFunc + uVar3);
      }
      pwVar12 = pwVar12 + -0x40;
      bVar1 = 7 < nVars;
      nVars = iVar4;
    } while (bVar1);
    nVars = 6;
  }
  Dau_DsdTruth6Compose_rec(*pFunc,pFanins,pRes,nVars,nWordsR);
  return;
}

Assistant:

void Dau_DsdTruthCompose_rec( word * pFunc, word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], word * pRes, int nVars, int nWordsR )
{
    int nWordsF;
    if ( nVars <= 6 )
    {
        Dau_DsdTruth6Compose_rec( pFunc[0], pFanins, pRes, nVars, nWordsR );
        return;
    }
    nWordsF = Abc_TtWordNum( nVars );
    assert( nWordsF > 1 );
    if ( Abc_TtIsConst0(pFunc, nWordsF) )
    {
        Abc_TtConst0( pRes, nWordsR );
        return;
    }
    if ( Abc_TtIsConst1(pFunc, nWordsF) )
    {
        Abc_TtConst1( pRes, nWordsR );
        return;
    }
    if ( !Abc_TtHasVar( pFunc, nVars, nVars-1 ) )
    {
        Dau_DsdTruthCompose_rec( pFunc, pFanins, pRes, nVars-1, nWordsR );
        return;
    }
    {
        word pTtTemp[2][DAU_MAX_WORD];
        nVars--;
        Dau_DsdTruthCompose_rec( pFunc,             pFanins, pTtTemp[0], nVars, nWordsR );
        Dau_DsdTruthCompose_rec( pFunc + nWordsF/2, pFanins, pTtTemp[1], nVars, nWordsR );
        Abc_TtMux( pRes, pFanins[nVars], pTtTemp[1], pTtTemp[0], nWordsR );
        return;
    }
}